

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFCommon.cpp
# Opt level: O2

void glTFCommon::Util::EncodeBase64(uint8_t *in,size_t inLength,string *out)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  size_type sVar4;
  
  sVar4 = out->_M_string_length;
  std::__cxx11::string::resize((ulong)out);
  uVar1 = 2;
  do {
    if (inLength <= uVar1 - 2) {
      return;
    }
    (out->_M_dataplus)._M_p[sVar4] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="[in[uVar1 - 2] >> 2];
    uVar3 = (ulong)((in[uVar1 - 2] & 3) << 4);
    if (uVar1 - 1 < inLength) {
      (out->_M_dataplus)._M_p[sVar4 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="
           [in[uVar1 - 1] >> 4 | uVar3];
      uVar3 = (ulong)((in[uVar1 - 1] & 0xf) << 2);
      if (inLength <= uVar1) {
        (out->_M_dataplus)._M_p[sVar4 + 2] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="[uVar3];
        goto LAB_00617b74;
      }
      (out->_M_dataplus)._M_p[sVar4 + 2] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="
           [in[uVar1] >> 6 | uVar3];
      cVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="[in[uVar1] & 0x3f];
    }
    else {
      (out->_M_dataplus)._M_p[sVar4 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="[uVar3];
      (out->_M_dataplus)._M_p[sVar4 + 2] = '=';
LAB_00617b74:
      cVar2 = '=';
    }
    (out->_M_dataplus)._M_p[sVar4 + 3] = cVar2;
    sVar4 = sVar4 + 4;
    uVar1 = uVar1 + 3;
  } while( true );
}

Assistant:

void EncodeBase64(const uint8_t* in, size_t inLength, std::string& out) {
    size_t outLength = ((inLength + 2) / 3) * 4;

    size_t j = out.size();
    out.resize(j + outLength);

    for (size_t i = 0; i < inLength; i += 3) {
        uint8_t b = (in[i] & 0xFC) >> 2;
        out[j++] = EncodeCharBase64(b);

        b = (in[i] & 0x03) << 4;
        if (i + 1 < inLength) {
            b |= (in[i + 1] & 0xF0) >> 4;
            out[j++] = EncodeCharBase64(b);

            b = (in[i + 1] & 0x0F) << 2;
            if (i + 2 < inLength) {
                b |= (in[i + 2] & 0xC0) >> 6;
                out[j++] = EncodeCharBase64(b);

                b = in[i + 2] & 0x3F;
                out[j++] = EncodeCharBase64(b);
            }
            else {
                out[j++] = EncodeCharBase64(b);
                out[j++] = '=';
            }
        }
        else {
            out[j++] = EncodeCharBase64(b);
            out[j++] = '=';
            out[j++] = '=';
        }
    }
}